

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::
verifyIntegerGreaterOrEqual2
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          GLint reference1)

{
  bool bVar1;
  qpTestResult qVar2;
  uchar (*pauVar3) [2];
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  int local_30;
  bool local_2c [2];
  undefined1 local_2a [2];
  int ndx;
  GLboolean referenceAsGLBoolean [2];
  StateQueryMemoryWriteGuard<unsigned_char[2]> boolVector;
  GLint reference1_local;
  GLint reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  _referenceAsGLBoolean = reference1;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::
  StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_char[2]> *)(local_2c + 2));
  pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)(local_2c + 2));
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*pauVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_char[2]> *)(local_2c + 2),testCtx);
  if (bVar1) {
    local_2c[0] = reference0 != 0;
    local_2c[1] = _referenceAsGLBoolean != 0;
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)(local_2c + 2));
      if ((*pauVar3)[local_30] != '\x01') {
        pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)(local_2c + 2));
        if ((*pauVar3)[local_30] == '\0') {
          if (local_2c[local_30] != false) {
            pTVar4 = tcu::TestContext::getLog(testCtx);
            tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_1b0,(char (*) [27])"// ERROR: expected GL_TRUE");
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1b0);
            qVar2 = tcu::TestContext::getTestResult(testCtx);
            if (qVar2 == QP_TEST_RESULT_PASS) {
              tcu::TestContext::setTestResult
                        (testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
            }
          }
        }
        else {
          pTVar4 = tcu::TestContext::getLog(testCtx);
          tcu::TestLog::operator<<(&local_340,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_340,(char (*) [39])"// ERROR: expected GL_TRUE or GL_FALSE");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_340);
          qVar2 = tcu::TestContext::getTestResult(testCtx);
          if (qVar2 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value")
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyIntegerGreaterOrEqual2 (tcu::TestContext& testCtx, GLenum name, GLint reference0, GLint reference1)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[2]> boolVector;
	glGetBooleanv(name, boolVector);

	if (!boolVector.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[2] =
	{
		reference0 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference1 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(referenceAsGLBoolean); ++ndx)
	{
		if (boolVector[ndx] == GL_TRUE) // state is non-zero, could be greater than any integer
		{
			continue;
		}
		else if (boolVector[ndx] == GL_FALSE) // state is zero
		{
			if (referenceAsGLBoolean[ndx] > 0) // and reference is greater than zero?
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE" << TestLog::EndMessage;
				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
			}
		}
		else
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE or GL_FALSE" << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
		}
	}
}